

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O3

void __thiscall
glcts::TextureBufferActiveUniformValidationVSFS::createProgram
          (TextureBufferActiveUniformValidationVSFS *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  TestError *this_00;
  char *vsCode;
  char *fsCode;
  long lVar5;
  
  iVar2 = (*((this->super_TextureBufferActiveUniformValidation).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(lVar5 + 0x3c8))();
  (this->super_TextureBufferActiveUniformValidation).m_po_id = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Error creating program object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                  ,0x210);
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Error creating shader object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                  ,0x213);
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Error creating shader object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
                  ,0x216);
  fsCode = 
  "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\nprecision highp float;\n\nuniform highp samplerBuffer  sampler_buffer;\nuniform highp isamplerBuffer isampler_buffer;\nuniform highp usamplerBuffer usampler_buffer;\n\nlayout(location = 0) out vec4 outColor;\nvoid main(void)\n{\n    outColor =  texelFetch(sampler_buffer, 0);\n    outColor += vec4(texelFetch(isampler_buffer, 0));\n    outColor += vec4(texelFetch(usampler_buffer, 0));\n}\n"
  ;
  vsCode = 
  "${VERSION}\n\nprecision highp float;\n\nvoid main(void)\n{\n    gl_Position = vec4(0.0, 0.0, 0.0, 0.0);\n}\n"
  ;
  bVar1 = TestCaseBase::buildProgram
                    ((TestCaseBase *)this,(this->super_TextureBufferActiveUniformValidation).m_po_id
                     ,this->m_fs_id,1,&fsCode,this->m_vs_id,1,&vsCode,(bool *)0x0);
  if (bVar1) {
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Error building a program!",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferActiveUniformValidation.cpp"
             ,0x21d);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBufferActiveUniformValidationVSFS::createProgram(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program object!");

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating shader object!");

	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating shader object!");

	const char* fsCode = getFragmentShaderCode();
	const char* vsCode = getVertexShaderCode();

	if (!buildProgram(m_po_id, m_fs_id, 1, &fsCode, m_vs_id, 1, &vsCode))
	{
		TCU_FAIL("Error building a program!");
	}
}